

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

void xmlSchemaSimpleTypeErr
               (xmlSchemaAbstractCtxtPtr actxt,xmlParserErrors error,xmlNodePtr node,xmlChar *value,
               xmlSchemaTypePtr type,int displayValue)

{
  uint uVar1;
  int iVar2;
  xmlChar *pxVar3;
  xmlChar *add;
  char *pcVar4;
  xmlChar *str;
  xmlChar *local_48;
  xmlChar *local_40;
  xmlParserErrors local_34;
  
  local_48 = (xmlChar *)0x0;
  local_34 = error;
  xmlSchemaFormatNodeForError(&local_48,actxt,node);
  pxVar3 = xmlStrcat(local_48,(xmlChar *)"\'%s\' is not a valid value of ");
  local_48 = pxVar3;
  iVar2 = xmlSchemaIsGlobalItem(type);
  pcVar4 = "the ";
  if (iVar2 == 0) {
    pcVar4 = "the local ";
  }
  local_48 = xmlStrcat(pxVar3,(xmlChar *)pcVar4);
  uVar1 = type->flags;
  if ((uVar1 >> 8 & 1) == 0) {
    if ((uVar1 & 0x40) != 0) {
      pcVar4 = "list type";
      goto LAB_001c4580;
    }
    if ((char)uVar1 < '\0') {
      pcVar4 = "union type";
      goto LAB_001c4580;
    }
  }
  else {
    pcVar4 = "atomic type";
LAB_001c4580:
    local_48 = xmlStrcat(local_48,(xmlChar *)pcVar4);
  }
  iVar2 = xmlSchemaIsGlobalItem(type);
  if (iVar2 == 0) goto LAB_001c4662;
  local_40 = (xmlChar *)0x0;
  local_48 = xmlStrcat(local_48," \'");
  if (type->builtInType == 0) {
    pxVar3 = xmlSchemaFormatQName(&local_40,type->targetNamespace,type->name);
    if (local_40 == (xmlChar *)0x0) goto LAB_001c45e0;
  }
  else {
    local_48 = xmlStrcat(local_48,"xs:");
    pxVar3 = type->name;
LAB_001c45e0:
    local_40 = xmlStrdup(pxVar3);
  }
  pxVar3 = local_48;
  add = xmlEscapeFormatString(&local_40);
  local_48 = xmlStrcat(pxVar3,add);
  local_48 = xmlStrcat(local_48,"\'");
  if (local_40 != (xmlChar *)0x0) {
    (*xmlFree)(local_40);
    local_40 = (xmlChar *)0x0;
  }
LAB_001c4662:
  local_48 = xmlStrcat(local_48,".\n");
  xmlSchemaErr4Line(actxt,XML_ERR_ERROR,local_34,node,0,(char *)local_48,value,(xmlChar *)0x0,
                    (xmlChar *)0x0,(xmlChar *)0x0);
  if (local_48 != (xmlChar *)0x0) {
    (*xmlFree)(local_48);
  }
  return;
}

Assistant:

static void
xmlSchemaSimpleTypeErr(xmlSchemaAbstractCtxtPtr actxt,
		       xmlParserErrors error,
		       xmlNodePtr node,
		       const xmlChar *value,
		       xmlSchemaTypePtr type,
		       int displayValue)
{
    xmlChar *msg = NULL;

    xmlSchemaFormatNodeForError(&msg, actxt, node);

    if (displayValue || (xmlSchemaEvalErrorNodeType(actxt, node) ==
	    XML_ATTRIBUTE_NODE))
	msg = xmlStrcat(msg, BAD_CAST "'%s' is not a valid value of ");
    else
	msg = xmlStrcat(msg, BAD_CAST "The character content is not a valid "
	    "value of ");

    if (! xmlSchemaIsGlobalItem(type))
	msg = xmlStrcat(msg, BAD_CAST "the local ");
    else
	msg = xmlStrcat(msg, BAD_CAST "the ");

    if (WXS_IS_ATOMIC(type))
	msg = xmlStrcat(msg, BAD_CAST "atomic type");
    else if (WXS_IS_LIST(type))
	msg = xmlStrcat(msg, BAD_CAST "list type");
    else if (WXS_IS_UNION(type))
	msg = xmlStrcat(msg, BAD_CAST "union type");

    if (xmlSchemaIsGlobalItem(type)) {
	xmlChar *str = NULL;
	msg = xmlStrcat(msg, BAD_CAST " '");
	if (type->builtInType != 0) {
	    msg = xmlStrcat(msg, BAD_CAST "xs:");
	    str = xmlStrdup(type->name);
	} else {
	    const xmlChar *qName = xmlSchemaFormatQName(&str, type->targetNamespace, type->name);
	    if (!str)
		str = xmlStrdup(qName);
	}
	msg = xmlStrcat(msg, xmlEscapeFormatString(&str));
	msg = xmlStrcat(msg, BAD_CAST "'");
	FREE_AND_NULL(str);
    }
    msg = xmlStrcat(msg, BAD_CAST ".\n");
    if (displayValue || (xmlSchemaEvalErrorNodeType(actxt, node) ==
	    XML_ATTRIBUTE_NODE))
	xmlSchemaErr(actxt, error, node, (const char *) msg, value, NULL);
    else
	xmlSchemaErr(actxt, error, node, (const char *) msg, NULL, NULL);
    FREE_AND_NULL(msg)
}